

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void transformTest(void)

{
  ostream *poVar1;
  array<float,_8UL> *paVar2;
  long lVar3;
  long lVar4;
  array<int,_8UL> *__dest;
  float fVar5;
  array<std::array<float,_8UL>,_8UL> coeff;
  array<std::array<int,_8UL>,_8UL> mat;
  array<std::array<float,_8UL>,_8UL> icoeff;
  array<std::array<float,_8UL>,_8UL> local_328;
  array<std::array<int,_8UL>,_8UL> local_228;
  array<float,_8UL> local_128 [8];
  
  __dest = local_228._M_elems;
  memcpy(__dest,&DAT_00129bb4,0x100);
  poVar1 = std::operator<<((ostream *)&std::cout,"Original block:-");
  std::endl<char,std::char_traits<char>>(poVar1);
  lVar3 = 0;
  while (lVar3 != 0x100) {
    lVar3 = lVar3 + 0x20;
    for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 4) {
      poVar1 = (ostream *)
               std::ostream::operator<<
                         (&std::cout,
                          *(int *)((long)((array<int,_8UL> *)__dest->_M_elems)->_M_elems + lVar4));
      std::operator<<(poVar1,"\t");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    __dest = __dest + 1;
  }
  paVar2 = local_328._M_elems;
  DCTTest((array<std::array<float,_8UL>,_8UL> *)paVar2,&local_228);
  poVar1 = std::operator<<((ostream *)&std::cout,"\nAfter DCT:-");
  lVar3 = 0;
  while( true ) {
    std::endl<char,std::char_traits<char>>(poVar1);
    if (lVar3 == 0x100) break;
    lVar3 = lVar3 + 0x20;
    for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 4) {
      poVar1 = (ostream *)
               std::ostream::operator<<
                         (&std::cout,
                          *(float *)((long)((array<float,_8UL> *)paVar2->_M_elems)->_M_elems + lVar4
                                    ));
      std::operator<<(poVar1,"\t");
    }
    paVar2 = paVar2 + 1;
    poVar1 = (ostream *)&std::cout;
  }
  paVar2 = local_128;
  IDCTTest((array<std::array<float,_8UL>,_8UL> *)paVar2,&local_328);
  poVar1 = std::operator<<((ostream *)&std::cout,"\nAfter IDCT:-");
  lVar3 = 0;
  while( true ) {
    std::endl<char,std::char_traits<char>>(poVar1);
    if (lVar3 == 0x100) break;
    lVar3 = lVar3 + 0x20;
    for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 4) {
      fVar5 = roundf(*(float *)((long)((array<float,_8UL> *)paVar2->_M_elems)->_M_elems + lVar4));
      poVar1 = std::ostream::_M_insert<long_double>((longdouble)fVar5);
      std::operator<<(poVar1,"\t");
    }
    paVar2 = paVar2 + 1;
    poVar1 = (ostream *)&std::cout;
  }
  return;
}

Assistant:

void transformTest()
{
    std::array<std::array<int, 8>, 8> mat 
    {
        std::array<int, 8>{ 52, 55, 61, 66, 70, 61, 64, 73 },
        std::array<int, 8>{ 63, 59, 55, 90, 109, 85, 69, 72 },
        std::array<int, 8>{ 62, 59, 68, 113, 144, 104, 66, 73 },
        std::array<int, 8>{ 63, 58, 71, 122, 154, 106, 70, 69 },
        std::array<int, 8>{ 67, 61, 68, 104, 126, 88, 68, 70 },
        std::array<int, 8>{ 79, 65, 60, 70, 77, 68, 58, 75 },
        std::array<int, 8>{ 85, 71, 64, 59, 55, 61, 65, 83 },
        std::array<int, 8>{ 87, 79, 69, 68, 65, 76, 78, 94 }
    };
    
    std::cout << "Original block:-" << std::endl;
    for (auto&& row: mat )
    {
        for ( auto&& v : row )
            std::cout << v << "\t";
        std::cout << std::endl;
    }
    
    auto coeff = DCTTest( mat );
    
    std::cout << "\nAfter DCT:-" << std::endl;
    
    for (auto&& row: coeff )
    {
        for ( auto&& v : row )
            std::cout << v << "\t";
        std::cout << std::endl;
    }
    
    auto icoeff = IDCTTest( coeff );
    
    std::cout << "\nAfter IDCT:-" << std::endl;
    
    for (auto&& row: icoeff )
    {
        for ( auto&& v : row )
            std::cout << std::roundl( v ) << "\t";
        std::cout << std::endl;
    }
}